

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall spectest::JSONParser::ExpectKey(JSONParser *this,char *key)

{
  long lVar1;
  JSONParser *pJVar2;
  size_t sVar3;
  bool bVar4;
  Result RVar5;
  char *pcVar6;
  undefined8 uStack_50;
  JSONParser *local_48;
  Enum local_40;
  Enum local_3c;
  char *local_38;
  char *quoted;
  size_t quoted_len;
  size_t keylen;
  char *key_local;
  JSONParser *this_local;
  
  uStack_50 = 0x2bbe51;
  local_48 = this;
  keylen = (size_t)key;
  key_local = (char *)this;
  quoted_len = strlen(key);
  sVar3 = keylen;
  pcVar6 = (char *)(quoted_len + 3);
  lVar1 = -(quoted_len + 0x12 & 0xfffffffffffffff0);
  local_38 = (char *)((long)&local_48 + lVar1);
  quoted = pcVar6;
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x2bbe94;
  snprintf((char *)((long)&local_48 + lVar1),(size_t)pcVar6,"\"%s\"",sVar3);
  pcVar6 = local_38;
  pJVar2 = local_48;
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x2bbea1;
  RVar5 = Expect(pJVar2,pcVar6);
  local_3c = RVar5.enum_;
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x2bbeac;
  bVar4 = wabt::Failed(RVar5);
  pJVar2 = local_48;
  if (bVar4) {
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x2bbec0;
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x2bbed6;
    RVar5 = Expect(pJVar2,":");
    local_40 = RVar5.enum_;
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x2bbee1;
    bVar4 = wabt::Failed(RVar5);
    if (bVar4) {
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x2bbef5;
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x2bbf04;
      wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ExpectKey(const char* key) {
  size_t keylen = strlen(key);
  size_t quoted_len = keylen + 2 + 1;
  char* quoted = static_cast<char*>(alloca(quoted_len));
  snprintf(quoted, quoted_len, "\"%s\"", key);
  EXPECT(quoted);
  EXPECT(":");
  return wabt::Result::Ok;
}